

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Symbol * __thiscall slang::ast::Expression::getSymbolReference(Expression *this,bool allowPacked)

{
  TimingControl *pTVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  AssignmentExpression *assign;
  
LAB_00357c2c:
  switch(this->kind) {
  default:
    goto switchD_00357c3d_caseD_a;
  case 0xe:
    bVar3 = AssignmentExpression::isLValueArg((AssignmentExpression *)this);
    lVar4 = 0x40;
    if (!bVar3) {
      return (Symbol *)0x0;
    }
    break;
  case 0x12:
  case 0x13:
    this = *(Expression **)((long)this + 0x30);
    bVar2 = allowPacked & 1;
    allowPacked = true;
    if (bVar2 == 0) goto code_r0x00357c6c;
    goto LAB_00357c2c;
  case 0x14:
    if ((allowPacked & 1U) == 0) {
      pTVar1 = *(TimingControl **)((long)this + 0x38);
      bVar3 = Type::isClass((Type *)pTVar1->syntax);
      if (((!bVar3) && (bVar3 = Type::isUnpackedStruct((Type *)pTVar1->syntax), !bVar3)) &&
         (bVar3 = Type::isUnpackedUnion((Type *)pTVar1->syntax), !bVar3)) {
        return (Symbol *)0x0;
      }
    }
  case 8:
  case 9:
  case 0x19:
    return *(Symbol **)((long)this + 0x30);
  case 0x16:
    lVar4 = 0x38;
    if (1 < (int)(((optional<slang::ast::BinaryOperator> *)((long)this + 0x30))->
                 super__Optional_base<slang::ast::BinaryOperator,_true,_true>)._M_payload.
                 super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload._M_value) {
      return (Symbol *)0x0;
    }
  }
  this = *(Expression **)((long)this + lVar4);
  goto LAB_00357c2c;
code_r0x00357c6c:
  bVar3 = Type::isUnpackedArray(*(Type **)((long)this + 8));
  allowPacked = true;
  if (!bVar3) {
switchD_00357c3d_caseD_a:
    return (Symbol *)0x0;
  }
  goto LAB_00357c2c;
}

Assistant:

const Symbol* Expression::getSymbolReference(bool allowPacked) const {
    switch (kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue:
            return &as<ValueExpressionBase>().symbol;
        case ExpressionKind::ElementSelect: {
            auto& val = as<ElementSelectExpression>().value();
            return (allowPacked || val.type->isUnpackedArray()) ? val.getSymbolReference()
                                                                : nullptr;
        }
        case ExpressionKind::RangeSelect: {
            auto& val = as<RangeSelectExpression>().value();
            return (allowPacked || val.type->isUnpackedArray()) ? val.getSymbolReference()
                                                                : nullptr;
        }
        case ExpressionKind::MemberAccess: {
            auto& access = as<MemberAccessExpression>();
            auto& val = access.value();
            if (allowPacked || val.type->isClass() || val.type->isUnpackedStruct() ||
                val.type->isUnpackedUnion()) {
                return &access.member;
            }
            return nullptr;
        }
        case ExpressionKind::ArbitrarySymbol:
            return as<ArbitrarySymbolExpression>().symbol;
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            if (conv.isImplicit())
                return conv.operand().getSymbolReference(allowPacked);
            return nullptr;
        }
        case ExpressionKind::Assignment: {
            auto& assign = as<AssignmentExpression>();
            if (assign.isLValueArg())
                return assign.left().getSymbolReference(allowPacked);
            return nullptr;
        }
        default:
            return nullptr;
    }
}